

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O2

shared_ptr<duckdb::BaseFileReader,_true>
duckdb::ParquetMultiFileInfo::CreateReader
          (ClientContext *context,OpenFileInfo *file,ParquetOptions *options,
          MultiFileOptions *param_4)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::BaseFileReader,_true> sVar2;
  undefined8 local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  make_shared_ptr<duckdb::ParquetReader,duckdb::ClientContext&,duckdb::OpenFileInfo_const&,duckdb::ParquetOptions&>
            ((ClientContext *)&local_18,file,options);
  _Var1._M_pi = _Stack_10._M_pi;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)context = local_18;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(context + 8) = _Var1._M_pi;
  local_18 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_10);
  sVar2.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)context;
  return (shared_ptr<duckdb::BaseFileReader,_true>)
         sVar2.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<BaseFileReader> ParquetMultiFileInfo::CreateReader(ClientContext &context, const OpenFileInfo &file,
                                                              ParquetOptions &options, const MultiFileOptions &) {
	return make_shared_ptr<ParquetReader>(context, file, options);
}